

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O0

int del_epoll(int fd)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  undefined1 local_1c [8];
  epoll_event ev;
  int rc;
  int fd_local;
  
  ev.data.u64._4_4_ = fd;
  ev.data.fd = epoll_ctl(cfg.epoll_fd,2,fd,(epoll_event *)local_1c);
  __stream = _stderr;
  if (ev.data.fd == -1) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    fprintf(__stream,"epoll_ctl: %s\n",pcVar2);
  }
  return ev.data.fd;
}

Assistant:

int del_epoll(int fd) {
  int rc;
  struct epoll_event ev;
  rc = epoll_ctl(cfg.epoll_fd, EPOLL_CTL_DEL, fd, &ev);
  if (rc == -1) {
    fprintf(stderr,"epoll_ctl: %s\n", strerror(errno));
  }
  return rc;
}